

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall testing::TestCase::UnshuffleTests(TestCase *this)

{
  size_type sVar1;
  reference pvVar2;
  ulong local_18;
  size_t i;
  TestCase *this_local;
  
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(&this->test_indices_);
    if (sVar1 <= local_18) break;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->test_indices_,local_18);
    *pvVar2 = (value_type)local_18;
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void TestCase::UnshuffleTests() {
  for (size_t i = 0; i < test_indices_.size(); i++) {
    test_indices_[i] = static_cast<int>(i);
  }
}